

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBackwardCompatibility.cpp
# Opt level: O2

void anon_unknown.dwarf_34fb0::diffImageFiles(char *fn1,char *fn2)

{
  int iVar1;
  int iVar2;
  BaseExc *pBVar3;
  allocator<char> local_6c5;
  allocator<char> local_6c4;
  allocator<char> local_6c3;
  allocator<char> local_6c2;
  allocator<char> local_6c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a0;
  string e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  stringstream _iex_throw_s;
  ostream local_5b0 [376];
  ifstream i2;
  char local_428 [16];
  byte abStack_418 [488];
  ifstream i1;
  char local_220 [16];
  byte abStack_210 [488];
  
  std::ifstream::ifstream(&i1);
  std::ifstream::ifstream(&i2);
  std::filebuf::open(local_220,(_Ios_Openmode)fn1);
  std::filebuf::open(local_428,(_Ios_Openmode)fn2);
  if (*(int *)(abStack_210 + *(long *)(_i1 + -0x18)) != 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6a0,"cannot open ",(allocator<char> *)&local_640);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6c0,fn1,(allocator<char> *)&local_660);
    std::operator+(&e,&local_6a0,&local_6c0);
    std::operator<<(local_5b0,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    std::__cxx11::string::~string((string *)&local_6c0);
    std::__cxx11::string::~string((string *)&local_6a0);
    pBVar3 = (BaseExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::BaseExc::BaseExc(pBVar3,(stringstream *)&_iex_throw_s);
    __cxa_throw(pBVar3,&Iex_3_2::BaseExc::typeinfo,Iex_3_2::BaseExc::~BaseExc);
  }
  if (*(int *)(abStack_418 + *(long *)(_i2 + -0x18)) != 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6a0,"cannot open ",(allocator<char> *)&local_640);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6c0,fn2,(allocator<char> *)&local_660);
    std::operator+(&e,&local_6a0,&local_6c0);
    std::operator<<(local_5b0,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    std::__cxx11::string::~string((string *)&local_6c0);
    std::__cxx11::string::~string((string *)&local_6a0);
    pBVar3 = (BaseExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::BaseExc::BaseExc(pBVar3,(stringstream *)&_iex_throw_s);
    __cxa_throw(pBVar3,&Iex_3_2::BaseExc::typeinfo,Iex_3_2::BaseExc::~BaseExc);
  }
  while (((abStack_210[*(long *)(_i1 + -0x18)] & 2) == 0 &&
         ((abStack_418[*(long *)(_i2 + -0x18)] & 2) == 0))) {
    iVar1 = std::istream::get();
    iVar2 = std::istream::get();
    if (iVar1 != iVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_640,"v1.7 and current differences between \'",&local_6c1);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_660,fn1,&local_6c2);
      std::operator+(&local_6c0,&local_640,&local_660);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_5e0,"\' & \'",&local_6c3);
      std::operator+(&local_6a0,&local_6c0,&local_5e0);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_600,fn2,&local_6c4);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &_iex_throw_s,&local_6a0,&local_600);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_620,"\'",&local_6c5);
      std::operator+(&e,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &_iex_throw_s,&local_620);
      std::__cxx11::string::~string((string *)&local_620);
      std::__cxx11::string::~string((string *)&_iex_throw_s);
      std::__cxx11::string::~string((string *)&local_600);
      std::__cxx11::string::~string((string *)&local_6a0);
      std::__cxx11::string::~string((string *)&local_5e0);
      std::__cxx11::string::~string((string *)&local_6c0);
      std::__cxx11::string::~string((string *)&local_660);
      std::__cxx11::string::~string((string *)&local_640);
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
      std::operator<<(local_5b0,(string *)&e);
      pBVar3 = (BaseExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::BaseExc::BaseExc(pBVar3,(stringstream *)&_iex_throw_s);
      __cxa_throw(pBVar3,&Iex_3_2::BaseExc::typeinfo,Iex_3_2::BaseExc::~BaseExc);
    }
  }
  std::ifstream::~ifstream(&i2);
  std::ifstream::~ifstream(&i1);
  return;
}

Assistant:

void
diffImageFiles (const char* fn1, const char* fn2)
{
    ifstream i1, i2;
    testutil::OpenStreamWithUTF8Name (i1, fn1, ios::in | ios::binary);
    testutil::OpenStreamWithUTF8Name (i2, fn2, ios::in | ios::binary);

    if (!i1.good ())
    {
        THROW (IEX_NAMESPACE::BaseExc, string ("cannot open ") + string (fn1));
    }
    if (!i2.good ())
    {
        THROW (IEX_NAMESPACE::BaseExc, string ("cannot open ") + string (fn2));
    }

    while (!i1.eof () && !i2.eof ())
    {
        if (i1.get () != i2.get ())
        {
            string e = string ("v1.7 and current differences between '") +
                       string (fn1) + string ("' & '") + string (fn2) +
                       string ("'");
            THROW (IEX_NAMESPACE::BaseExc, e);
        }
    }
}